

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img2webp.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int parse_error_1;
  int sharpyuv_version;
  int mux_version;
  int enc_version;
  int parse_error;
  int ok;
  CommandLineArguments cmd_args;
  int last_input_index;
  int have_input;
  int c;
  WebPData webp_data;
  WebPPicture pic;
  WebPConfig config;
  WebPAnimEncoderOptions anim_config;
  int height;
  int width;
  int loop_count;
  int timestamp_ms;
  int duration;
  int pic_num;
  int verbose;
  WebPAnimEncoder *enc;
  char *output;
  uint in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbc;
  undefined1 in_stack_fffffffffffffdbd;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  int in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  uint in_stack_fffffffffffffdc8;
  uint in_stack_fffffffffffffdcc;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  long local_220;
  int local_1fc;
  int local_1f4;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  uint local_1d8;
  uint in_stack_fffffffffffffe2c;
  WebPPicture *in_stack_fffffffffffffe30;
  WebPAnimEncoder *in_stack_fffffffffffffe38;
  WebPConfig local_dc;
  undefined4 local_60;
  int local_5c;
  int local_58;
  int local_54;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  int local_24;
  WebPAnimEncoder *local_20;
  long local_18;
  long local_10;
  int local_8;
  uint local_4;
  
  local_4 = 0;
  local_18 = 0;
  local_20 = (WebPAnimEncoder *)0x0;
  local_24 = 0;
  local_28 = 0;
  local_2c = 100;
  local_30 = 0;
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  bVar3 = false;
  local_1fc = 0;
  uVar1 = ExUtilInitCommandLineArguments
                    (in_stack_fffffffffffffdc0,
                     (char **)CONCAT17(in_stack_fffffffffffffdbf,
                                       CONCAT16(in_stack_fffffffffffffdbe,
                                                CONCAT15(in_stack_fffffffffffffdbd,
                                                         CONCAT14(in_stack_fffffffffffffdbc,
                                                                  in_stack_fffffffffffffdb8)))),
                     (CommandLineArguments *)
                     CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  if (uVar1 == 0) {
    local_4 = 1;
  }
  else {
    local_10 = local_220;
    local_8 = in_stack_fffffffffffffdd8;
    WebPDataInit((WebPData *)0x1036f5);
    iVar2 = WebPAnimEncoderOptionsInit((WebPAnimEncoderOptions *)0x103702);
    if (((iVar2 == 0) || (iVar2 = WebPConfigInit((WebPConfig *)0x103714), iVar2 == 0)) ||
       (iVar2 = WebPPictureInit((WebPPicture *)0x103723), iVar2 == 0)) {
      fprintf(stderr,"Library version mismatch!\n");
      uVar1 = 0;
    }
    else {
      for (local_1f4 = 0; uVar1 != 0 && local_1f4 < local_8; local_1f4 = local_1f4 + 1) {
        if (**(char **)(local_10 + (long)local_1f4 * 8) == '-') {
          in_stack_fffffffffffffdd0 = 0;
          iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-o");
          if ((iVar2 == 0) && (local_1f4 + 1 < local_8)) {
            *(undefined8 *)(local_10 + (long)local_1f4 * 8) = 0;
            local_1f4 = local_1f4 + 1;
            local_18 = *(long *)(local_10 + (long)local_1f4 * 8);
          }
          else {
            iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-kmin");
            if ((iVar2 == 0) && (local_1f4 + 1 < local_8)) {
              *(undefined8 *)(local_10 + (long)local_1f4 * 8) = 0;
              local_1f4 = local_1f4 + 1;
              local_5c = ExUtilGetInt((char *)CONCAT44(in_stack_fffffffffffffdb4,
                                                       in_stack_fffffffffffffdb0),
                                      in_stack_fffffffffffffdac,(int *)0x103881);
            }
            else {
              iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-kmax");
              if ((iVar2 == 0) && (local_1f4 + 1 < local_8)) {
                *(undefined8 *)(local_10 + (long)local_1f4 * 8) = 0;
                local_1f4 = local_1f4 + 1;
                local_58 = ExUtilGetInt((char *)CONCAT44(in_stack_fffffffffffffdb4,
                                                         in_stack_fffffffffffffdb0),
                                        in_stack_fffffffffffffdac,(int *)0x1038fa);
              }
              else {
                iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-loop");
                if ((iVar2 == 0) && (local_1f4 + 1 < local_8)) {
                  *(undefined8 *)(local_10 + (long)local_1f4 * 8) = 0;
                  local_1f4 = local_1f4 + 1;
                  local_34 = ExUtilGetInt((char *)CONCAT44(in_stack_fffffffffffffdb4,
                                                           in_stack_fffffffffffffdb0),
                                          in_stack_fffffffffffffdac,(int *)0x103977);
                  if ((int)local_34 < 0) {
                    fprintf(stderr,"Invalid non-positive loop-count (%d)\n",(ulong)local_34);
                    in_stack_fffffffffffffdd0 = 1;
                  }
                }
                else {
                  iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-min_size");
                  if (iVar2 == 0) {
                    local_60 = 1;
                  }
                  else {
                    iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-mixed");
                    if (iVar2 == 0) {
                      local_54 = 1;
                      local_dc.lossless = 0;
                    }
                    else {
                      iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-near_lossless");
                      if ((iVar2 == 0) && (local_1f4 + 1 < local_8)) {
                        *(undefined8 *)(local_10 + (long)local_1f4 * 8) = 0;
                        local_1f4 = local_1f4 + 1;
                        local_dc.near_lossless =
                             ExUtilGetInt((char *)CONCAT44(in_stack_fffffffffffffdb4,
                                                           in_stack_fffffffffffffdb0),
                                          in_stack_fffffffffffffdac,(int *)0x103a90);
                      }
                      else {
                        iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-sharp_yuv");
                        if (iVar2 == 0) {
                          local_dc.use_sharp_yuv = 1;
                        }
                        else {
                          iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-v");
                          if (iVar2 != 0) {
                            iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-h");
                            if ((iVar2 == 0) ||
                               (iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-help"),
                               iVar2 == 0)) {
                              Help();
                              return 0;
                            }
                            iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-version");
                            if (iVar2 != 0) goto LAB_00103c84;
                            in_stack_fffffffffffffdcc = WebPGetEncoderVersion();
                            in_stack_fffffffffffffdc8 = WebPGetMuxVersion();
                            iVar2 = SharpYuvGetVersion();
                            printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
                                   (ulong)((int)in_stack_fffffffffffffdcc >> 0x10 & 0xff),
                                   (ulong)((int)in_stack_fffffffffffffdcc >> 8 & 0xff),
                                   (ulong)(in_stack_fffffffffffffdcc & 0xff),
                                   (ulong)((int)in_stack_fffffffffffffdc8 >> 0x10 & 0xff),
                                   (ulong)((int)in_stack_fffffffffffffdc8 >> 8 & 0xff),
                                   in_stack_fffffffffffffdc8 & 0xff);
                            printf("libsharpyuv: %d.%d.%d\n",(ulong)(iVar2 >> 0x18 & 0xff),
                                   (ulong)(iVar2 >> 0x10 & 0xffff));
                            goto LAB_00104341;
                          }
                          local_24 = 1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          uVar1 = (uint)((in_stack_fffffffffffffdd0 != 0 ^ 0xffU) & 1);
          if (uVar1 == 0) goto LAB_00104341;
          *(undefined8 *)(local_10 + (long)local_1f4 * 8) = 0;
        }
        else {
          bVar3 = true;
        }
LAB_00103c84:
      }
      if (bVar3) {
        local_28 = 0;
        local_dc.lossless = 1;
        for (local_1f4 = 0; uVar1 != 0 && local_1f4 < local_8; local_1f4 = local_1f4 + 1) {
          if (*(long *)(local_10 + (long)local_1f4 * 8) != 0) {
            if (**(char **)(local_10 + (long)local_1f4 * 8) == '-') {
              in_stack_fffffffffffffdc0 = 0;
              iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-lossy");
              if (iVar2 == 0) {
                if (local_54 == 0) {
                  local_dc.lossless = 0;
                }
              }
              else {
                iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-lossless");
                if (iVar2 == 0) {
                  if (local_54 == 0) {
                    local_dc.lossless = 1;
                  }
                }
                else {
                  iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-q");
                  if ((iVar2 == 0) && (local_1f4 + 1 < local_8)) {
                    local_1f4 = local_1f4 + 1;
                    local_dc.quality =
                         ExUtilGetFloat((char *)CONCAT44(uVar1,in_stack_fffffffffffffdd0),
                                        (int *)CONCAT44(in_stack_fffffffffffffdcc,
                                                        in_stack_fffffffffffffdc8));
                  }
                  else {
                    iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-m");
                    if ((iVar2 == 0) && (local_1f4 + 1 < local_8)) {
                      local_1f4 = local_1f4 + 1;
                      local_dc.method =
                           ExUtilGetInt((char *)CONCAT44(in_stack_fffffffffffffdb4,
                                                         in_stack_fffffffffffffdb0),
                                        in_stack_fffffffffffffdac,(int *)0x103e81);
                    }
                    else {
                      iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-d");
                      if ((iVar2 == 0) && (local_1f4 + 1 < local_8)) {
                        local_1f4 = local_1f4 + 1;
                        local_2c = ExUtilGetInt((char *)CONCAT44(in_stack_fffffffffffffdb4,
                                                                 in_stack_fffffffffffffdb0),
                                                in_stack_fffffffffffffdac,(int *)0x103ee5);
                        if ((int)local_2c < 1) {
                          fprintf(stderr,"Invalid negative duration (%d)\n",(ulong)local_2c);
                          in_stack_fffffffffffffdc0 = 1;
                        }
                      }
                      else {
                        iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-exact");
                        if (iVar2 == 0) {
                          local_dc.exact = 1;
                        }
                        else {
                          iVar2 = strcmp(*(char **)(local_10 + (long)local_1f4 * 8),"-noexact");
                          if (iVar2 == 0) {
                            local_dc.exact = 0;
                          }
                          else {
                            in_stack_fffffffffffffdc0 = 1;
                            fprintf(stderr,"Unknown option [%s]\n",
                                    *(undefined8 *)(local_10 + (long)local_1f4 * 8));
                          }
                        }
                      }
                    }
                  }
                }
              }
              uVar1 = (uint)((in_stack_fffffffffffffdc0 != 0 ^ 0xffU) & 1);
              if (uVar1 == 0) {
                uVar1 = 0;
                goto LAB_00104341;
              }
            }
            else {
              if ((uVar1 != 0) && (uVar1 = WebPValidateConfig(&local_dc), uVar1 == 0)) {
                fprintf(stderr,"Invalid configuration.\n");
                goto LAB_00104341;
              }
              in_stack_fffffffffffffe20 = 1;
              uVar1 = ReadImage((char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8
                                                ),
                                (WebPPicture *)
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
              local_1fc = local_1f4;
              if (uVar1 == 0) {
                uVar1 = 0;
                goto LAB_00104341;
              }
              if (local_20 == (WebPAnimEncoder *)0x0) {
                local_38 = local_1d8;
                local_3c = in_stack_fffffffffffffe2c;
                local_20 = WebPAnimEncoderNew(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0,
                                              (WebPAnimEncoderOptions *)
                                              CONCAT44(in_stack_fffffffffffffdac,
                                                       in_stack_fffffffffffffda8));
                uVar1 = (uint)(local_20 != (WebPAnimEncoder *)0x0);
                if (uVar1 == 0) {
                  fprintf(stderr,"Could not create WebPAnimEncoder object.\n");
                }
              }
              if ((uVar1 != 0) &&
                 (uVar1 = (uint)(local_38 == local_1d8 && local_3c == in_stack_fffffffffffffe2c),
                 uVar1 == 0)) {
                in_stack_fffffffffffffda8 = local_3c;
                fprintf(stderr,
                        "Frame #%d dimension mismatched! Got %d x %d. Was expecting %d x %d.\n",
                        (ulong)local_28,(ulong)local_1d8,(ulong)in_stack_fffffffffffffe2c,
                        (ulong)local_38);
              }
              if ((uVar1 != 0) &&
                 (uVar1 = WebPAnimEncoderAdd(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                             in_stack_fffffffffffffe2c,
                                             (WebPConfig *)
                                             CONCAT44(in_stack_fffffffffffffe24,
                                                      in_stack_fffffffffffffe20)), uVar1 == 0)) {
                fprintf(stderr,"Error while adding frame #%d\n",(ulong)local_28);
              }
              WebPPictureFree((WebPPicture *)0x1041c4);
              if (uVar1 == 0) {
                uVar1 = 0;
                goto LAB_00104341;
              }
              if (local_24 != 0) {
                fprintf(stderr,"Added frame #%3d at time %4d (file: %s)\n",(ulong)local_28,
                        (ulong)local_30,*(undefined8 *)(local_10 + (long)local_1f4 * 8));
              }
              local_30 = local_2c + local_30;
              local_28 = local_28 + 1;
            }
          }
        }
        while (local_1f4 = local_1fc + 1, local_1f4 < local_8) {
          local_1fc = local_1f4;
          if (*(long *)(local_10 + (long)local_1f4 * 8) != 0) {
            fprintf(stderr,"Warning: unused option [%s]! Frame options go before the input frame.\n"
                    ,*(undefined8 *)(local_10 + (long)local_1f4 * 8));
          }
        }
        bVar3 = false;
        if (uVar1 != 0) {
          iVar2 = WebPAnimEncoderAdd(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                     in_stack_fffffffffffffe2c,
                                     (WebPConfig *)
                                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          bVar3 = iVar2 != 0;
        }
        uVar1 = 0;
        if (bVar3) {
          iVar2 = WebPAnimEncoderAssemble
                            ((WebPAnimEncoder *)
                             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                             (WebPData *)
                             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
          uVar1 = (uint)(iVar2 != 0) << 0x18;
        }
        uVar1 = uVar1 >> 0x18;
        if (uVar1 == 0) {
          fprintf(stderr,"Error during final animation assembly.\n");
        }
      }
      else {
        fprintf(stderr,"No input file(s) for generating animation!\n");
        uVar1 = 0;
        Help();
      }
    }
LAB_00104341:
    WebPAnimEncoderDelete
              ((WebPAnimEncoder *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    if ((uVar1 != 0) && (0 < (int)local_34)) {
      uVar1 = SetLoopCount(in_stack_fffffffffffffdd0,
                           (WebPData *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                          );
    }
    if (uVar1 != 0) {
      if (local_18 == 0) {
        fprintf(stderr,"[no output file specified]   ");
      }
      else {
        uVar1 = ImgIoUtilWriteFile((char *)CONCAT44(in_stack_fffffffffffffddc,
                                                    in_stack_fffffffffffffdd8),
                                   (uint8_t *)CONCAT44(uVar1,in_stack_fffffffffffffdd0),
                                   CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        if (uVar1 != 0) {
          fprintf(stderr,"output file: %s     ",local_18);
        }
      }
    }
    if (uVar1 != 0) {
      fprintf(stderr,"[%d frames, %u bytes].\n",(ulong)local_28);
    }
    WebPDataClear((WebPData *)0x10441b);
    ExUtilDeleteCommandLineArguments((CommandLineArguments *)0x104425);
    local_4 = (uint)(uVar1 == 0);
  }
  return local_4;
}

Assistant:

int main(int argc, const char* argv[]) {
  const char* output = NULL;
  WebPAnimEncoder* enc = NULL;
  int verbose = 0;
  int pic_num = 0;
  int duration = 100;
  int timestamp_ms = 0;
  int loop_count = 0;
  int width = 0, height = 0;
  WebPAnimEncoderOptions anim_config;
  WebPConfig config;
  WebPPicture pic;
  WebPData webp_data;
  int c;
  int have_input = 0;
  int last_input_index = 0;
  CommandLineArguments cmd_args;
  int ok;

  INIT_WARGV(argc, argv);

  ok = ExUtilInitCommandLineArguments(argc - 1, argv + 1, &cmd_args);
  if (!ok) FREE_WARGV_AND_RETURN(EXIT_FAILURE);

  argc = cmd_args.argc_;
  argv = cmd_args.argv_;

  WebPDataInit(&webp_data);
  if (!WebPAnimEncoderOptionsInit(&anim_config) ||
      !WebPConfigInit(&config) ||
      !WebPPictureInit(&pic)) {
    fprintf(stderr, "Library version mismatch!\n");
    ok = 0;
    goto End;
  }

  // 1st pass of option parsing
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c][0] == '-') {
      int parse_error = 0;
      if (!strcmp(argv[c], "-o") && c + 1 < argc) {
        argv[c] = NULL;
        output = (const char*)GET_WARGV_SHIFTED(argv, ++c);
      } else if (!strcmp(argv[c], "-kmin") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmin = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-kmax") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmax = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-loop") && c + 1 < argc) {
        argv[c] = NULL;
        loop_count = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (loop_count < 0) {
          fprintf(stderr, "Invalid non-positive loop-count (%d)\n", loop_count);
          parse_error = 1;
        }
      } else if (!strcmp(argv[c], "-min_size")) {
        anim_config.minimize_size = 1;
      } else if (!strcmp(argv[c], "-mixed")) {
        anim_config.allow_mixed = 1;
        config.lossless = 0;
      } else if (!strcmp(argv[c], "-near_lossless") && c + 1 < argc) {
        argv[c] = NULL;
        config.near_lossless = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-sharp_yuv")) {
        config.use_sharp_yuv = 1;
      } else if (!strcmp(argv[c], "-v")) {
        verbose = 1;
      } else if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help")) {
        Help();
        FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
      } else if (!strcmp(argv[c], "-version")) {
        const int enc_version = WebPGetEncoderVersion();
        const int mux_version = WebPGetMuxVersion();
        const int sharpyuv_version = SharpYuvGetVersion();
        printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
               (enc_version >> 16) & 0xff, (enc_version >> 8) & 0xff,
               enc_version & 0xff, (mux_version >> 16) & 0xff,
               (mux_version >> 8) & 0xff, mux_version & 0xff);
        printf("libsharpyuv: %d.%d.%d\n", (sharpyuv_version >> 24) & 0xff,
               (sharpyuv_version >> 16) & 0xffff, sharpyuv_version & 0xff);
        goto End;
      } else {
        continue;
      }
      ok = !parse_error;
      if (!ok) goto End;
      argv[c] = NULL;   // mark option as 'parsed' during 1st pass
    } else {
      have_input |= 1;
    }
  }
  if (!have_input) {
    fprintf(stderr, "No input file(s) for generating animation!\n");
    ok = 0;
    Help();
    goto End;
  }

  // image-reading pass
  pic_num = 0;
  config.lossless = 1;
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c] == NULL) continue;
    if (argv[c][0] == '-') {    // parse local options
      int parse_error = 0;
      if (!strcmp(argv[c], "-lossy")) {
        if (!anim_config.allow_mixed) config.lossless = 0;
      } else if (!strcmp(argv[c], "-lossless")) {
        if (!anim_config.allow_mixed) config.lossless = 1;
      } else if (!strcmp(argv[c], "-q") && c + 1 < argc) {
        config.quality = ExUtilGetFloat(argv[++c], &parse_error);
      } else if (!strcmp(argv[c], "-m") && c + 1 < argc) {
        config.method = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-d") && c + 1 < argc) {
        duration = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (duration <= 0) {
          fprintf(stderr, "Invalid negative duration (%d)\n", duration);
          parse_error = 1;
        }
      } else if (!strcmp(argv[c], "-exact")) {
        config.exact = 1;
      } else if (!strcmp(argv[c], "-noexact")) {
        config.exact = 0;
      } else {
        parse_error = 1;   // shouldn't be here.
        fprintf(stderr, "Unknown option [%s]\n", argv[c]);
      }
      ok = !parse_error;
      if (!ok) goto End;
      continue;
    }

    if (ok) {
      ok = WebPValidateConfig(&config);
      if (!ok) {
        fprintf(stderr, "Invalid configuration.\n");
        goto End;
      }
    }

    // read next input image
    pic.use_argb = 1;
    ok = ReadImage((const char*)GET_WARGV_SHIFTED(argv, c), &pic);
    last_input_index = c;
    if (!ok) goto End;

    if (enc == NULL) {
      width  = pic.width;
      height = pic.height;
      enc = WebPAnimEncoderNew(width, height, &anim_config);
      ok = (enc != NULL);
      if (!ok) {
        fprintf(stderr, "Could not create WebPAnimEncoder object.\n");
      }
    }

    if (ok) {
      ok = (width == pic.width && height == pic.height);
      if (!ok) {
        fprintf(stderr, "Frame #%d dimension mismatched! "
                        "Got %d x %d. Was expecting %d x %d.\n",
                pic_num, pic.width, pic.height, width, height);
      }
    }

    if (ok) {
      ok = WebPAnimEncoderAdd(enc, &pic, timestamp_ms, &config);
      if (!ok) {
        fprintf(stderr, "Error while adding frame #%d\n", pic_num);
      }
    }
    WebPPictureFree(&pic);
    if (!ok) goto End;

    if (verbose) {
      WFPRINTF(stderr, "Added frame #%3d at time %4d (file: %s)\n",
               pic_num, timestamp_ms, GET_WARGV_SHIFTED(argv, c));
    }
    timestamp_ms += duration;
    ++pic_num;
  }

  for (c = last_input_index + 1; c < argc; ++c) {
    if (argv[c] != NULL) {
      fprintf(stderr, "Warning: unused option [%s]!"
                      " Frame options go before the input frame.\n", argv[c]);
    }
  }

  // add a last fake frame to signal the last duration
  ok = ok && WebPAnimEncoderAdd(enc, NULL, timestamp_ms, NULL);
  ok = ok && WebPAnimEncoderAssemble(enc, &webp_data);
  if (!ok) {
    fprintf(stderr, "Error during final animation assembly.\n");
  }

 End:
  // free resources
  WebPAnimEncoderDelete(enc);

  if (ok && loop_count > 0) {  // Re-mux to add loop count.
    ok = SetLoopCount(loop_count, &webp_data);
  }

  if (ok) {
    if (output != NULL) {
      ok = ImgIoUtilWriteFile(output, webp_data.bytes, webp_data.size);
      if (ok) WFPRINTF(stderr, "output file: %s     ", (const W_CHAR*)output);
    } else {
      fprintf(stderr, "[no output file specified]   ");
    }
  }

  if (ok) {
    fprintf(stderr, "[%d frames, %u bytes].\n",
            pic_num, (unsigned int)webp_data.size);
  }
  WebPDataClear(&webp_data);
  ExUtilDeleteCommandLineArguments(&cmd_args);
  FREE_WARGV_AND_RETURN(ok ? EXIT_SUCCESS : EXIT_FAILURE);
}